

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.cpp
# Opt level: O1

BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4> *
duckdb::BaseNode<(unsigned_char)'\x10',_(duckdb::NType)4>::DeleteChildInternal
          (ART *art,Node *node,uint8_t byte)

{
  BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4> *pBVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  byte bVar3;
  type paVar4;
  long *plVar5;
  pointer this;
  data_ptr_t pdVar6;
  ulong uVar7;
  ulong uVar8;
  __hash_code __code;
  ulong uVar9;
  long *plVar10;
  long lVar11;
  
  uVar8 = (node->super_IndexPointer).data;
  paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var2._M_head_impl =
       paVar4->_M_elems[3].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  uVar7 = uVar8 & 0xffffffff;
  plVar5 = *(long **)(*(long *)&((_Var2._M_head_impl)->buffers)._M_h +
                     (uVar7 % *(size_type *)((long)&(_Var2._M_head_impl)->buffers + 8)) * 8);
  for (plVar10 = (long *)*plVar5; uVar7 != plVar10[1]; plVar10 = (long *)*plVar10) {
    plVar5 = plVar10;
  }
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)(*plVar5 + 0x10));
  pdVar6 = FixedSizeBuffer::Get(this,true);
  lVar11 = (ulong)((uint)(uVar8 >> 0x20) & 0xffffff) * (_Var2._M_head_impl)->segment_size;
  pBVar1 = (BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4> *)
           (pdVar6 + (_Var2._M_head_impl)->bitmask_offset + lVar11);
  uVar9 = (ulong)pdVar6[(_Var2._M_head_impl)->bitmask_offset + lVar11];
  uVar7 = 0;
  uVar8 = uVar7;
  if (uVar9 != 0) {
    do {
      uVar8 = uVar7;
      if (pBVar1->key[uVar7] == byte) break;
      uVar7 = uVar7 + 1;
      uVar8 = uVar9;
    } while (uVar9 != uVar7);
  }
  uVar7 = uVar8 & 0xff;
  Node::Free(art,pBVar1->children + uVar7);
  bVar3 = pBVar1->count - 1;
  pBVar1->count = bVar3;
  if ((byte)uVar8 < bVar3) {
    do {
      pBVar1->key[uVar7] = pBVar1->key[uVar7 + 1];
      pBVar1->children[uVar7].super_IndexPointer.data =
           pBVar1->children[uVar7 + 1].super_IndexPointer.data;
      uVar7 = uVar7 + 1;
    } while (uVar7 < pBVar1->count);
  }
  return pBVar1;
}

Assistant:

BaseNode<CAPACITY, TYPE> &BaseNode<CAPACITY, TYPE>::DeleteChildInternal(ART &art, Node &node, const uint8_t byte) {
	auto &n = Node::Ref<BaseNode>(art, node, TYPE);

	uint8_t child_pos = 0;
	for (; child_pos < n.count; child_pos++) {
		if (n.key[child_pos] == byte) {
			break;
		}
	}

	// Free the child and decrease the count.
	Node::Free(art, n.children[child_pos]);
	n.count--;

	// Possibly move children backwards.
	for (uint8_t i = child_pos; i < n.count; i++) {
		n.key[i] = n.key[i + 1];
		n.children[i] = n.children[i + 1];
	}
	return n;
}